

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O1

void __thiscall PF_BufferMgr::~PF_BufferMgr(PF_BufferMgr *this)

{
  void *pvVar1;
  StatisticsMgr *pSVar2;
  long lVar3;
  long lVar4;
  
  if (0 < this->numPages) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pvVar1 = *(void **)((long)&this->bufTable->pData + lVar3);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 < this->numPages);
  }
  if (this->bufTable != (PF_BufPageDesc *)0x0) {
    operator_delete__(this->bufTable);
  }
  pSVar2 = pStatisticsMgr;
  if (pStatisticsMgr != (StatisticsMgr *)0x0) {
    StatisticsMgr::~StatisticsMgr(pStatisticsMgr);
    operator_delete(pSVar2);
  }
  PF_HashTable::~PF_HashTable(&this->hashTable);
  return;
}

Assistant:

PF_BufferMgr::~PF_BufferMgr()
{
   // Free up buffer pages and tables
   for (int i = 0; i < this->numPages; i++)
      delete [] bufTable[i].pData;

   delete [] bufTable;

#ifdef PF_STATS
   // Destroy the global statistics manager
   delete pStatisticsMgr;
#endif

#ifdef PF_LOG
   WriteLog("Destroyed the buffer manager.\n");
#endif
}